

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::ConcatenationExpression::fromSyntax
          (Compilation *compilation,ConcatenationExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SymbolKind SVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar2;
  Compilation *compilation_00;
  bool bVar3;
  bool bVar4;
  bitwidth_t bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Expression *pEVar9;
  reference pvVar10;
  Type *pTVar11;
  Type *pTVar12;
  undefined4 extraout_var_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar13;
  SourceLocation SVar14;
  undefined7 extraout_var;
  ConstantRange CVar15;
  Diagnostic *pDVar16;
  undefined4 extraout_var_01;
  ConcatenationExpression *pCVar17;
  int iVar18;
  bitmask<slang::ast::ASTFlags> extraFlags;
  ASTContext *extraout_RDX;
  ASTContext *extraout_RDX_00;
  ASTContext *extraout_RDX_01;
  ASTContext *extraout_RDX_02;
  ASTContext *extraout_RDX_03;
  ASTContext *extraout_RDX_04;
  ASTContext *extraout_RDX_05;
  ASTContext *src;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  ASTContext *extraout_RDX_08;
  size_t extraout_RDX_09;
  EVP_PKEY_CTX *extraout_RDX_10;
  EVP_PKEY_CTX *extraout_RDX_11;
  EVP_PKEY_CTX *extraout_RDX_12;
  EVP_PKEY_CTX *extraout_RDX_13;
  EVP_PKEY_CTX *extraout_RDX_14;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *extraout_RDX_15;
  size_t extraout_RDX_16;
  bitmask<slang::ast::IntegralFlags> bVar19;
  underlying_type uVar20;
  bitwidth_t width;
  ulong uVar21;
  long lVar22;
  Type *pTVar23;
  SourceRange SVar24;
  Expression *arg;
  Expression *arg_1;
  SmallVector<slang::ast::Expression_*,_5UL> buffer;
  bitmask<slang::ast::AssignFlags> *in_stack_ffffffffffffff10;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_d8;
  Compilation *local_c0;
  ConcatenationExpressionSyntax *local_b8;
  Type *local_b0;
  Type *local_a8;
  SourceRange local_a0;
  ulong local_90;
  SmallVectorBase<slang::ast::Expression_*> local_88 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  
  src = context;
  local_c0 = compilation;
  local_b8 = syntax;
  if ((assignmentTarget == (Type *)0x0) ||
     (bVar3 = Type::isUnpackedArray(assignmentTarget), src = extraout_RDX, !bVar3)) {
    local_88[0].data_ = (pointer)local_88[0].firstElement;
    local_88[0].len = 0;
    local_88[0].cap = 5;
    uVar21 = (local_b8->expressions).elements._M_extent._M_extent_value + 1;
    width = 0;
    bVar19.m_bits = '\0';
    pTVar23 = (Type *)0x0;
    if (1 < uVar21) {
      uVar21 = uVar21 >> 1;
      lVar22 = 0;
      local_a8 = (Type *)0x0;
      local_b0 = (Type *)0x0;
      width = 0;
      uVar20 = '\0';
      do {
        ppSVar13 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              ((long)&(((local_b8->expressions).elements._M_ptr)->
                                      super_ConstTokenOrSyntax).
                                      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                              + lVar22));
        pSVar2 = *ppSVar13;
        extraFlags.m_bits._1_7_ = 0;
        extraFlags.m_bits._0_1_ =
             ((SyntaxNode *)&pSVar2->kind)->kind == MultipleConcatenationExpression;
        SVar14 = (SourceLocation)
                 Expression::create(local_c0,(ExpressionSyntax *)pSVar2,context,extraFlags,
                                    (Type *)0x0);
        local_a0.startLoc = SVar14;
        SmallVectorBase<slang::ast::Expression*>::emplace_back<slang::ast::Expression*const&>
                  ((SmallVectorBase<slang::ast::Expression*> *)local_88,(Expression **)&local_a0);
        bVar3 = Expression::bad((Expression *)local_a0.startLoc);
        if (bVar3) goto LAB_0042294b;
        pTVar23 = *(Type **)((long)local_a0.startLoc + 8);
        pTVar12 = pTVar23->canonical;
        src = extraout_RDX_00;
        if (pTVar12 == (Type *)0x0) {
          Type::resolveCanonical(pTVar23);
          pTVar12 = pTVar23->canonical;
          src = extraout_RDX_01;
        }
        SVar1 = (pTVar12->super_Symbol).kind;
        bVar19.m_bits = uVar20;
        if (SVar1 == StringType) {
          local_b0 = (Type *)0x1;
        }
        else if ((SVar1 != VoidType) ||
                (((SyntaxNode *)&pSVar2->kind)->kind != MultipleConcatenationExpression)) {
          bVar3 = Type::isIntegral(pTVar23);
          if (!bVar3) {
            pDVar16 = ASTContext::addDiag(context,(DiagCode)0x210007,
                                          *(SourceRange *)((long)local_a0.startLoc + 0x20));
            ast::operator<<(pDVar16,pTVar23);
            goto LAB_0042294b;
          }
          bVar3 = Expression::isUnsizedInteger((Expression *)local_a0.startLoc);
          if (((~bVar3 | (byte)local_a8) & 1) == 0) {
            pDVar16 = ASTContext::addDiag(context,(DiagCode)0xd80007,
                                          *(SourceRange *)((long)local_a0.startLoc + 0x20));
            bVar5 = Type::getBitWidth(pTVar23);
            local_d8._M_ptr = (pointer)(ulong)bVar5;
            pvVar10 = std::
                      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                      ::emplace_back<unsigned_long>(&pDVar16->args,(unsigned_long *)&local_d8);
            local_a8 = (Type *)CONCAT71((int7)((ulong)pvVar10 >> 8),1);
          }
          bVar5 = Type::getBitWidth(pTVar23);
          SVar24 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_b8);
          width = width + bVar5;
          bVar3 = ASTContext::requireValidBitWidth(context,width,SVar24);
          if (!bVar3) goto LAB_0042294b;
          bVar3 = Type::isFourState(pTVar23);
          src = extraout_RDX_02;
          bVar19.m_bits = '\x02';
          if (!bVar3) {
            bVar19.m_bits = uVar20;
          }
        }
        pTVar23 = local_b0;
        lVar22 = lVar22 + 0x30;
        uVar21 = uVar21 - 1;
        uVar20 = bVar19.m_bits;
      } while (uVar21 != 0);
      if (local_88[0].len != 0) {
        uVar21 = 0;
        do {
          if (((ulong)pTVar23 & 1) == 0) {
            Expression::selfDetermined
                      (context,(Expression **)((long)local_88[0].data_ + uVar21 * 8));
            src = extraout_RDX_04;
          }
          else {
            local_d8._M_ptr = *(pointer *)((long)local_88[0].data_ + uVar21 * 8);
            pTVar12 = (Type *)(((Type *)local_d8._M_ptr)->super_Symbol).name._M_len;
            pTVar11 = pTVar12->canonical;
            if (pTVar11 == (Type *)0x0) {
              Type::resolveCanonical(pTVar12);
              pTVar11 = pTVar12->canonical;
            }
            if ((pTVar11->super_Symbol).kind == StringType) {
              Expression::selfDetermined(context,(Expression **)&local_d8);
              pTVar12 = (Type *)local_d8._M_ptr;
              src = extraout_RDX_03;
            }
            else {
              bVar3 = Expression::isImplicitString((Expression *)local_d8._M_ptr);
              if (!bVar3) {
                ASTContext::addDiag(context,(DiagCode)0x420007,
                                    *(SourceRange *)&((Symbol *)local_d8._M_ptr)->parentScope);
                goto LAB_0042294b;
              }
              local_48 = 0;
              uStack_40 = 0;
              pTVar12 = (Type *)ConversionExpression::makeImplicit
                                          (context,local_c0->stringType,Implicit,
                                           (Expression *)local_d8._M_ptr,(Expression *)0x0,
                                           (SourceRange)ZEXT816(0));
              src = extraout_RDX_05;
            }
            *(Type **)((long)local_88[0].data_ + uVar21 * 8) = pTVar12;
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 < local_88[0].len);
      }
    }
    if ((((ulong)pTVar23 & 1) == 0) && (width == 0)) {
      SVar24 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_b8);
      ASTContext::addDiag(context,(DiagCode)0x4e0007,SVar24);
LAB_0042294b:
      compilation_00 = local_c0;
      pTVar23 = local_c0->errorType;
      local_d8._M_ptr = (pointer)0x0;
      local_d8._M_extent._M_extent_value = 0;
      local_a0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_b8);
      pCVar17 = BumpAllocator::
                emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange>
                          (&compilation_00->super_BumpAllocator,pTVar23,
                           (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)&local_d8
                           ,&local_a0);
      pCVar17 = (ConcatenationExpression *)
                Expression::badExpr(compilation_00,&pCVar17->super_Expression);
    }
    else {
      if (((ulong)pTVar23 & 1) == 0) {
        pTVar23 = Compilation::getType(local_c0,width,bVar19);
        src = extraout_RDX_08;
      }
      else {
        pTVar23 = local_c0->stringType;
      }
      iVar8 = SmallVectorBase<slang::ast::Expression_*>::copy
                        (local_88,(EVP_PKEY_CTX *)local_c0,(EVP_PKEY_CTX *)src);
      local_d8._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar8);
      local_d8._M_extent._M_extent_value = extraout_RDX_09;
      local_a0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_b8);
      pCVar17 = BumpAllocator::
                emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>,slang::SourceRange>
                          (&local_c0->super_BumpAllocator,pTVar23,&local_d8,&local_a0);
    }
  }
  else {
    pTVar23 = assignmentTarget->canonical;
    if (pTVar23 == (Type *)0x0) {
      Type::resolveCanonical(assignmentTarget);
      pTVar23 = assignmentTarget->canonical;
    }
    if ((pTVar23->super_Symbol).kind == AssociativeArrayType) {
      SVar24 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_b8);
      ASTContext::addDiag(context,(DiagCode)0xa60007,SVar24);
      pEVar9 = Expression::badExpr(local_c0,(Expression *)0x0);
      return pEVar9;
    }
    pTVar12 = Type::getArrayElementType(assignmentTarget);
    pTVar23 = pTVar12->canonical;
    src_00 = extraout_RDX_06;
    local_a8 = pTVar12;
    if (pTVar23 == (Type *)0x0) {
      Type::resolveCanonical(pTVar12);
      pTVar23 = pTVar12->canonical;
      src_00 = extraout_RDX_07;
    }
    SVar1 = (pTVar23->super_Symbol).kind;
    local_88[0].data_ = (pointer)local_88[0].firstElement;
    local_88[0].len = 0;
    local_88[0].cap = 5;
    uVar21 = (local_b8->expressions).elements._M_extent._M_extent_value + 1;
    if (uVar21 < 2) {
      local_b0 = (Type *)0x0;
      local_90 = 0;
      bVar3 = false;
    }
    else {
      uVar21 = uVar21 >> 1;
      lVar22 = 0;
      bVar3 = false;
      local_90 = 0;
      local_b0 = (Type *)0x0;
      do {
        ppSVar13 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              ((long)&(((local_b8->expressions).elements._M_ptr)->
                                      super_ConstTokenOrSyntax).
                                      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                              + lVar22));
        pSVar2 = *ppSVar13;
        local_d8._M_ptr = (pointer)0x0;
        if ((SVar1 != VirtualInterfaceType) ||
           (local_d8._M_ptr =
                 (pointer)Expression::tryBindInterfaceRef(context,(ExpressionSyntax *)pSVar2,false),
           (Type *)local_d8._M_ptr == (Type *)0x0)) {
          local_d8._M_ptr =
               (pointer)Expression::create(local_c0,(ExpressionSyntax *)pSVar2,context,
                                           (bitmask<slang::ast::ASTFlags>)0x0,(Type *)0x0);
        }
        bVar4 = Expression::bad((Expression *)local_d8._M_ptr);
        if (bVar4) {
          bVar3 = true;
          src_00 = extraout_RDX_10;
        }
        else {
          bVar4 = Expression::isImplicitlyAssignableTo
                            ((Expression *)local_d8._M_ptr,local_c0,local_a8);
          if (bVar4) {
            SVar24.endLoc = (SourceLocation)0x0;
            SVar24.startLoc = (SourceLocation)((Symbol *)local_d8._M_ptr)->nextInScope;
            SVar14 = (SourceLocation)
                     Expression::convertAssignment
                               ((Expression *)context,(ASTContext *)local_a8,(Type *)local_d8._M_ptr
                                ,(Expression *)((Symbol *)local_d8._M_ptr)->parentScope,SVar24,
                                (Expression **)0x0,in_stack_ffffffffffffff10);
            local_a0.startLoc = SVar14;
            SmallVectorBase<slang::ast::Expression*>::emplace_back<slang::ast::Expression*>
                      ((SmallVectorBase<slang::ast::Expression*> *)local_88,(Expression **)&local_a0
                      );
            local_b0 = (Type *)((long)&(local_b0->super_Symbol).kind + 1);
            src_00 = extraout_RDX_11;
          }
          else {
            pTVar23 = (Type *)(((Symbol *)local_d8._M_ptr)->name)._M_len;
            bVar4 = Type::isUnpackedArray(pTVar23);
            if (bVar4) {
              pTVar12 = Type::getArrayElementType(pTVar23);
              bVar4 = Type::isAssignmentCompatible(local_a8,pTVar12);
              if (bVar4) {
                bVar4 = Type::hasFixedRange(pTVar23);
                if (bVar4) {
                  CVar15 = Type::getFixedRange(pTVar23);
                  iVar7 = CVar15.left;
                  iVar18 = CVar15.right;
                  iVar8 = iVar7 - iVar18;
                  if (iVar7 - iVar18 == 0 || iVar7 < iVar18) {
                    iVar8 = -(iVar7 - iVar18);
                  }
                  local_b0 = (Type *)((long)&(local_b0->super_Symbol).kind + (ulong)(iVar8 + 1));
                }
                else {
                  local_90 = CONCAT71(extraout_var,1);
                }
                Expression::selfDetermined(context,(Expression **)&local_d8);
                SmallVectorBase<slang::ast::Expression*>::
                emplace_back<slang::ast::Expression*const&>
                          ((SmallVectorBase<slang::ast::Expression*> *)local_88,
                           (Expression **)&local_d8);
                src_00 = extraout_RDX_13;
                goto LAB_00422809;
              }
            }
            pDVar16 = ASTContext::addDiag(context,(DiagCode)0x210007,
                                          *(SourceRange *)&((Symbol *)local_d8._M_ptr)->parentScope)
            ;
            ast::operator<<(pDVar16,pTVar23);
            Expression::selfDetermined(context,(Expression **)&local_d8);
            SmallVectorBase<slang::ast::Expression*>::emplace_back<slang::ast::Expression*const&>
                      ((SmallVectorBase<slang::ast::Expression*> *)local_88,(Expression **)&local_d8
                      );
            bVar3 = true;
            src_00 = extraout_RDX_12;
          }
        }
LAB_00422809:
        lVar22 = lVar22 + 0x30;
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
    }
    if (((local_90 & 1) == 0 && !bVar3) &&
       (bVar4 = Type::hasFixedRange(assignmentTarget), src_00 = extraout_RDX_14, bVar4)) {
      CVar15 = Type::getFixedRange(assignmentTarget);
      iVar8 = CVar15.left;
      iVar7 = CVar15.right;
      src_00 = (EVP_PKEY_CTX *)(ulong)(uint)-(iVar8 - iVar7);
      uVar6 = iVar8 - iVar7;
      if (iVar8 - iVar7 == 0 || iVar8 < iVar7) {
        uVar6 = -(iVar8 - iVar7);
      }
      if (local_b0 != (Type *)(ulong)(uVar6 + 1)) {
        SVar24 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_b8);
        pDVar16 = ASTContext::addDiag(context,(DiagCode)0xa70007,SVar24);
        pDVar16 = ast::operator<<(pDVar16,assignmentTarget);
        CVar15 = Type::getFixedRange(assignmentTarget);
        iVar7 = CVar15.left;
        iVar18 = CVar15.right;
        iVar8 = iVar7 - iVar18;
        if (iVar7 - iVar18 == 0 || iVar7 < iVar18) {
          iVar8 = -(iVar7 - iVar18);
        }
        local_d8._M_ptr = (pointer)(ulong)(iVar8 + 1);
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar16->args,(unsigned_long *)&local_d8);
        local_d8._M_ptr = (pointer)local_b0;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar16->args,(unsigned_long *)&local_d8);
        bVar3 = true;
        src_00 = extraout_RDX_15;
      }
    }
    iVar8 = SmallVectorBase<slang::ast::Expression_*>::copy
                      (local_88,(EVP_PKEY_CTX *)local_c0,src_00);
    local_d8._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar8);
    local_d8._M_extent._M_extent_value = extraout_RDX_16;
    local_a0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_b8);
    pCVar17 = BumpAllocator::
              emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>,slang::SourceRange>
                        (&local_c0->super_BumpAllocator,assignmentTarget,&local_d8,&local_a0);
    if (bVar3) {
      pCVar17 = (ConcatenationExpression *)Expression::badExpr(local_c0,&pCVar17->super_Expression);
    }
  }
  if (local_88[0].data_ != (pointer)local_88[0].firstElement) {
    operator_delete(local_88[0].data_);
  }
  return &pCVar17->super_Expression;
}

Assistant:

Expression& ConcatenationExpression::fromSyntax(Compilation& compilation,
                                                const ConcatenationExpressionSyntax& syntax,
                                                const ASTContext& context,
                                                const Type* assignmentTarget) {
    // If we are in an assignment-like context with a target type that is an unpacked array,
    // this is an array concatenation (as opposed to a vector or string concatenation).
    if (assignmentTarget && assignmentTarget->isUnpackedArray()) {
        if (assignmentTarget->isAssociativeArray()) {
            context.addDiag(diag::UnpackedConcatAssociative, syntax.sourceRange());
            return badExpr(compilation, nullptr);
        }

        bool bad = false;
        bool anyDynamic = false;
        size_t totalElems = 0;
        const Type& type = *assignmentTarget;
        const Type& elemType = *type.getArrayElementType();
        const bool isVirtualIface = elemType.isVirtualInterface();
        SmallVector<Expression*> buffer;

        for (auto argSyntax : syntax.expressions) {
            Expression* arg = nullptr;
            if (isVirtualIface) {
                arg = tryBindInterfaceRef(context, *argSyntax,
                                          /* isInterfacePort */ false);
            }

            if (!arg)
                arg = &create(compilation, *argSyntax, context);

            if (arg->bad()) {
                bad = true;
                continue;
            }

            if (arg->isImplicitlyAssignableTo(compilation, elemType)) {
                buffer.push_back(&convertAssignment(context, elemType, *arg, arg->sourceRange));
                totalElems++;
                continue;
            }

            // The argument can be an unpacked array as long as its element type is
            // assignment compatible with the target.
            auto& argType = *arg->type;
            if (argType.isUnpackedArray() &&
                elemType.isAssignmentCompatible(*argType.getArrayElementType())) {
                // If this is a dynamic array we can't check element counts statically.
                // Otherwise we should count each fixed element in the total.
                if (argType.hasFixedRange())
                    totalElems += argType.getFixedRange().width();
                else
                    anyDynamic = true;

                selfDetermined(context, arg);
                buffer.push_back(arg);
                continue;
            }

            // Otherwise this is an error.
            bad = true;
            context.addDiag(diag::BadConcatExpression, arg->sourceRange) << argType;
            selfDetermined(context, arg);
            buffer.push_back(arg);
        }

        // If we have a fixed size source and target, check that they match in size.
        if (!bad && !anyDynamic && type.hasFixedRange() &&
            type.getFixedRange().width() != totalElems) {
            context.addDiag(diag::UnpackedConcatSize, syntax.sourceRange())
                << type << type.getFixedRange().width() << totalElems;
            bad = true;
        }

        auto result = compilation.emplace<ConcatenationExpression>(type, buffer.ccopy(compilation),
                                                                   syntax.sourceRange());
        if (bad)
            return badExpr(compilation, result);

        return *result;
    }

    bool errored = false;
    bool unsizedWarned = false;
    bool anyStrings = false;
    bitmask<IntegralFlags> flags;
    bitwidth_t totalWidth = 0;
    SmallVector<Expression*> buffer;

    for (auto argSyntax : syntax.expressions) {
        // Replications inside of concatenations have a special feature that allows them to have
        // a width of zero. Check now if we're going to be creating a replication and if so set
        // an additional flag so that it knows it's ok to have that zero count.
        Expression* arg;
        if (argSyntax->kind == SyntaxKind::MultipleConcatenationExpression)
            arg = &create(compilation, *argSyntax, context, ASTFlags::InsideConcatenation);
        else
            arg = &create(compilation, *argSyntax, context);
        buffer.push_back(arg);

        if (arg->bad()) {
            errored = true;
            break;
        }

        const Type& type = *arg->type;
        if (type.isVoid() && argSyntax->kind == SyntaxKind::MultipleConcatenationExpression)
            continue;

        if (type.isString()) {
            anyStrings = true;
            continue;
        }

        if (!type.isIntegral()) {
            errored = true;
            context.addDiag(diag::BadConcatExpression, arg->sourceRange) << type;
            break;
        }

        if (arg->isUnsizedInteger() && !unsizedWarned) {
            context.addDiag(diag::UnsizedInConcat, arg->sourceRange) << type.getBitWidth();
            unsizedWarned = true;
        }

        // Can't overflow because 2*maxWidth is still less than 2^32-1.
        totalWidth += type.getBitWidth();

        if (!context.requireValidBitWidth(totalWidth, syntax.sourceRange())) {
            errored = true;
            break;
        }

        if (type.isFourState())
            flags |= IntegralFlags::FourState;
    }

    if (!errored) {
        for (size_t i = 0; i < buffer.size(); i++) {
            if (!anyStrings) {
                selfDetermined(context, buffer[i]);
            }
            else {
                Expression* expr = buffer[i];
                if (expr->type->isString()) {
                    selfDetermined(context, expr);
                }
                else if (expr->isImplicitString()) {
                    expr = &ConversionExpression::makeImplicit(context, compilation.getStringType(),
                                                               ConversionKind::Implicit, *expr,
                                                               nullptr, {});
                }
                else {
                    errored = true;
                    context.addDiag(diag::ConcatWithStringInt, expr->sourceRange);
                    break;
                }
                buffer[i] = expr;
            }
        }

        if (!anyStrings && totalWidth == 0) {
            context.addDiag(diag::EmptyConcatNotAllowed, syntax.sourceRange());
            errored = true;
        }
    }

    if (errored) {
        return badExpr(compilation,
                       compilation.emplace<ConcatenationExpression>(compilation.getErrorType(),
                                                                    std::span<const Expression*>(),
                                                                    syntax.sourceRange()));
    }

    const Type* type;
    if (anyStrings)
        type = &compilation.getStringType();
    else
        type = &compilation.getType(totalWidth, flags);

    return *compilation.emplace<ConcatenationExpression>(*type, buffer.ccopy(compilation),
                                                         syntax.sourceRange());
}